

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O2

json * __thiscall
nanojson3::json::json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::read_string
          (json *__return_storage_ptr__,
          json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  bool bVar1;
  int_type iVar2;
  int_type iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bad_format *pbVar9;
  char cVar10;
  string_view reason;
  string_view reason_00;
  string_view reason_01;
  string_view reason_02;
  string_view reason_03;
  string_view reason_04;
  string_view reason_05;
  anon_class_8_1_8991fb9c hex;
  
  iVar2 = input_stream::peek(&this->input_);
  if (iVar2 != 0x22) {
    __assert_fail("*input_ == \'\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x471,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_string() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  iVar2 = input_stream::eat(&this->input_);
  (this->string_input_buffer_)._M_string_length = 0;
  *(this->string_input_buffer_)._M_dataplus._M_p = '\0';
  do {
    bVar1 = input_stream::eat(&this->input_,0x5c);
    cVar10 = (char)&this->string_input_buffer_;
    if (bVar1) {
      iVar3 = input_stream::peek(&this->input_);
      if ((((((iVar3 != 0x6e) && (iVar3 = input_stream::peek(&this->input_), iVar3 != 0x74)) &&
            (iVar3 = input_stream::peek(&this->input_), iVar3 != 0x62)) &&
           ((iVar3 = input_stream::peek(&this->input_), iVar3 != 0x66 &&
            (iVar3 = input_stream::peek(&this->input_), iVar3 != 0x72)))) &&
          ((iVar3 = input_stream::peek(&this->input_), iVar3 != 0x5c &&
           ((iVar3 = input_stream::peek(&this->input_), iVar3 != 0x2f &&
            (iVar3 = input_stream::peek(&this->input_), iVar3 != 0x22)))))) &&
         (iVar3 = input_stream::peek(&this->input_), iVar3 != 0x27)) {
        iVar3 = input_stream::peek(&this->input_);
        if (iVar3 != 0x75) {
          pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
          reason_02._M_str = "invalid string format: invalid escape sequence";
          reason_02._M_len = 0x2e;
          bad_format(pbVar9,this,reason_02,(optional<int>)0x0);
          goto LAB_00108623;
        }
        hex.this = this;
        input_stream::eat(&this->input_);
        iVar3 = input_stream::peek(&this->input_);
        iVar4 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
        input_stream::eat(&this->input_);
        iVar3 = input_stream::peek(&this->input_);
        iVar5 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
        input_stream::eat(&this->input_);
        iVar3 = input_stream::peek(&this->input_);
        uVar6 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
        input_stream::eat(&this->input_);
        iVar3 = input_stream::peek(&this->input_);
        uVar7 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
        uVar7 = uVar7 | (uVar6 | iVar5 << 4 | iVar4 << 8) << 4;
        if (0x7f < (int)uVar7) {
          if (0x7ff < uVar7) {
            if ((uVar7 & 0xf800) == 0xd800) {
              input_stream::eat(&this->input_);
              iVar3 = input_stream::peek(&this->input_);
              if (iVar3 != 0x5c) {
                pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
                uVar7 = input_stream::peek(&this->input_);
                reason_03._M_str = "invalid string format: expected surrogate pair";
                reason_03._M_len = 0x2e;
                bad_format(pbVar9,this,reason_03,(optional<int>)((ulong)uVar7 | 0x100000000));
                __cxa_throw(pbVar9,&exceptions::bad_format::typeinfo,
                            std::runtime_error::~runtime_error);
              }
              input_stream::eat(&this->input_);
              iVar3 = input_stream::peek(&this->input_);
              if (iVar3 != 0x75) {
                pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
                uVar7 = input_stream::peek(&this->input_);
                reason_04._M_str = "invalid string format: expected surrogate pair";
                reason_04._M_len = 0x2e;
                bad_format(pbVar9,this,reason_04,(optional<int>)((ulong)uVar7 | 0x100000000));
                __cxa_throw(pbVar9,&exceptions::bad_format::typeinfo,
                            std::runtime_error::~runtime_error);
              }
              input_stream::eat(&this->input_);
              iVar3 = input_stream::peek(&this->input_);
              iVar4 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
              input_stream::eat(&this->input_);
              iVar3 = input_stream::peek(&this->input_);
              iVar5 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
              input_stream::eat(&this->input_);
              iVar3 = input_stream::peek(&this->input_);
              uVar6 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
              input_stream::eat(&this->input_);
              iVar3 = input_stream::peek(&this->input_);
              uVar8 = read_string::anon_class_8_1_8991fb9c::operator()(&hex,iVar3);
              uVar8 = uVar8 | (uVar6 | iVar5 << 4 | iVar4 << 8) << 4;
              uVar6 = uVar8;
              if ((uVar8 & 0xfc00) != 0xd800 || (~uVar7 & 0xdc00) != 0) {
                uVar6 = uVar7;
                uVar7 = uVar8;
              }
              if (((uVar6 & 0xfc00) == 0xd800) && ((uVar7 & 0xfc00) == 0xdc00)) {
                std::__cxx11::string::push_back(cVar10);
                std::__cxx11::string::push_back(cVar10);
                std::__cxx11::string::push_back(cVar10);
                goto LAB_00108282;
              }
              pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
              reason_05._M_str = "invalid string format: invalid surrogate pair sequence";
              reason_05._M_len = 0x36;
              bad_format(pbVar9,this,reason_05,(optional<int>)0x0);
              goto LAB_00108623;
            }
            std::__cxx11::string::push_back(cVar10);
          }
          std::__cxx11::string::push_back(cVar10);
        }
      }
    }
    else {
      bVar1 = input_stream::eat(&this->input_,iVar2);
      if (bVar1) {
        std::__detail::__variant::
        _Variant_storage<false,std::monostate,decltype(nullptr),bool,long_long,long_double,std::__cxx11::string,std::vector<nanojson3::json,std::allocator<nanojson3::json>>,nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>>
        ::_Variant_storage<5ul,std::__cxx11::string&>
                  ((_Variant_storage<false,std::monostate,decltype(nullptr),bool,long_long,long_double,std::__cxx11::string,std::vector<nanojson3::json,std::allocator<nanojson3::json>>,nanojson3::internal::key_value_store<std::__cxx11::string,nanojson3::json,std::equal_to<void>,std::vector<std::pair<std::__cxx11::string_const,nanojson3::json>,std::allocator<std::pair<std::__cxx11::string_const,nanojson3::json>>>>>
                    *)__return_storage_ptr__,&this->string_input_buffer_);
        return __return_storage_ptr__;
      }
      iVar3 = input_stream::peek(&this->input_);
      if (iVar3 == -1) {
        pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
        reason_00._M_str = "invalid string format: unexpected eof";
        reason_00._M_len = 0x25;
        bad_format(pbVar9,this,reason_00,(optional<int>)0x0);
        goto LAB_00108623;
      }
      iVar3 = input_stream::peek(&this->input_);
      if ((iVar3 < 0x20) || (iVar3 = input_stream::peek(&this->input_), iVar3 == 0x7f)) {
        pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
        uVar7 = input_stream::peek(&this->input_);
        reason._M_str = "invalid string format: control character is not allowed";
        reason._M_len = 0x37;
        bad_format(pbVar9,this,reason,(optional<int>)((ulong)uVar7 | 0x100000000));
        goto LAB_00108623;
      }
      iVar3 = input_stream::peek(&this->input_);
      if ((iVar3 == 0x2f) && ((this->option_bits_ & allow_unescaped_forward_slash) == none)) {
        pbVar9 = (bad_format *)__cxa_allocate_exception(0x10);
        reason_01._M_str = "invalid string format: unescaped \'/\' is not allowed";
        reason_01._M_len = 0x33;
        bad_format(pbVar9,this,reason_01,(optional<int>)0x0);
LAB_00108623:
        __cxa_throw(pbVar9,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
      }
      input_stream::peek(&this->input_);
    }
LAB_00108282:
    std::__cxx11::string::push_back(cVar10);
    input_stream::eat(&this->input_);
  } while( true );
}

Assistant:

json read_string()
        {
            // check quote character
            assert(*input_ == '"');
            int_type quote = *input_++; // '"'

            auto& ret = string_input_buffer_;
            ret.clear();

            while (true)
            {
                if (input_.eat('\\')) // escape sequence found?
                {
                    if (*input_ == 'n') ret += '\n';
                    else if (*input_ == 't') ret += '\t';
                    else if (*input_ == 'b') ret += '\b';
                    else if (*input_ == 'f') ret += '\f';
                    else if (*input_ == 'r') ret += '\r';
                    else if (*input_ == '\\') ret += '\\';
                    else if (*input_ == '/') ret += '/';
                    else if (*input_ == '\"') ret += '\"';
                    else if (*input_ == '\'') ret += '\'';
                    else if (*input_ == 'u') // \uXXXX is converted to UTF-8 sequence
                    {
                        auto hex = [&](int_type chr)
                        {
                            if (chr >= '0' && chr <= '9') { return chr - '0'; }
                            if (chr >= 'A' && chr <= 'F') { return chr - 'A' + 10; }
                            if (chr >= 'a' && chr <= 'f') { return chr - 'a' + 10; }
                            throw bad_format("invalid string format: expected hexadecimal digit for \\u????", chr);
                        };

                        int code = 0;
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);

                        if (code < 0x80) // 7 bit
                        {
                            ret += static_cast<char>((code >> 0 & 0x7F) | 0x00);
                        }
                        else if (code < 0x0800) // 11 bit
                        {
                            ret += static_cast<char>((code >> 6 & 0x1f) | 0xC0);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                        else if ((code & 0xF800) == 0xD800) // surrogate pair
                        {
                            // assume next surrogate is following.
                            if (*++input_ != '\\') throw bad_format("invalid string format: expected surrogate pair", *input_);
                            if (*++input_ != 'u') throw bad_format("invalid string format: expected surrogate pair", *input_);

                            int code2 = 0;
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);

                            if ((code & 0xFC00) == 0xDC00 && (code2 & 0xFC00) == 0xD800)
                                std::swap(code, code2);

                            if ((code & 0xFC00) == 0xD800 && (code2 & 0xFC00) == 0xDC00)
                                code = ((code & 0x3FF) << 10 | (code2 & 0x3FF)) + 0x10000; // 21 bit
                            else
                                throw bad_format("invalid string format: invalid surrogate pair sequence");

                            ret += static_cast<char>((code >> 18 & 0x07) | 0xF0);
                            ret += static_cast<char>((code >> 12 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 6 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                        else // 16 bit
                        {
                            ret += static_cast<char>((code >> 12 & 0x0f) | 0xE0);
                            ret += static_cast<char>((code >> 6 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                    }
                    else
                    {
                        throw bad_format("invalid string format: invalid escape sequence");
                    }
                }
                else if (input_.eat(quote)) break; // end of string.
                else if (*input_ == EOF) throw bad_format("invalid string format: unexpected eof");
                else if (*input_ < 0x20 || *input_ == 0x7F) throw bad_format("invalid string format: control character is not allowed", *input_);
                else if (*input_ == '/' && !has_option(json_parse_option::allow_unescaped_forward_slash)) throw bad_format("invalid string format: unescaped '/' is not allowed");
                else ret += static_cast<char_type>(*input_); // OK. normal character.
                ++input_;
            }

            return json{in_place_index::string, ret}; // copy
        }